

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this)

{
  ~GeneratedCodeInfo_Annotation(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation() {
  // @@protoc_insertion_point(destructor:google.protobuf.GeneratedCodeInfo.Annotation)
  SharedDtor(*this);
}